

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

value_type *
winmd::reader::FixedArgSig::read_arg
          (value_type *__return_storage_ptr__,database *db,ParamSig *ctor_param,byte_view *data)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  ElemSig local_b8;
  uint local_88;
  allocator<char> local_81;
  uint32_t i;
  uint local_4c;
  undefined1 local_48 [4];
  uint num_elements;
  vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> elems;
  TypeSig *type_sig;
  byte_view *data_local;
  ParamSig *ctor_param_local;
  database *db_local;
  
  elems.super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ParamSig::Type(ctor_param);
  bVar1 = TypeSig::is_szarray((TypeSig *)
                              elems.
                              super__Vector_base<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    cppwinrt::std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::vector
              ((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_48);
    uVar2 = read<unsigned_int>(data);
    local_4c = uVar2;
    if (uVar2 != 0xffffffff) {
      uVar3 = byte_view::size(data);
      if (uVar3 < uVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"Invalid blob array size",&local_81);
        impl::throw_invalid((string *)&i);
      }
      cppwinrt::std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::
      reserve((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_48,
              (ulong)local_4c);
      for (local_88 = 0; local_88 < local_4c; local_88 = local_88 + 1) {
        std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>::
        emplace_back<winmd::reader::database_const&,winmd::reader::ParamSig_const&,winmd::reader::byte_view&>
                  ((vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>> *)local_48
                   ,db,ctor_param,data);
      }
    }
    std::
    variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
    ::
    variant<std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>,void,void,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>,void>
              ((variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                *)__return_storage_ptr__,
               (vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_48);
    cppwinrt::std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>::~vector
              ((vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_> *)local_48);
  }
  else {
    ElemSig::ElemSig(&local_b8,db,ctor_param,data);
    std::
    variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
    ::variant<winmd::reader::ElemSig,void,void,winmd::reader::ElemSig,void>
              ((variant<winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                *)__return_storage_ptr__,&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

static value_type read_arg(database const& db, ParamSig const& ctor_param, byte_view& data)
        {
            auto const& type_sig = ctor_param.Type();
            if (type_sig.is_szarray())
            {
                std::vector<ElemSig> elems;
                auto const num_elements = read<uint32_t>(data);
                if (num_elements != 0xffffffff)
                {
                    if (num_elements > data.size())
                    {
                        impl::throw_invalid("Invalid blob array size");
                    }
                    elems.reserve(num_elements);
                    for (uint32_t i = 0; i < num_elements; ++i)
                    {
                        elems.emplace_back(db, ctor_param, data);
                    }
                }
                return elems;
            }
            else
            {
                return ElemSig{ db, ctor_param, data };
            }
        }